

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void rune_xtra_act(keypress ch,wchar_t oid)

{
  _Bool _Var1;
  quark_t qVar2;
  char *pcVar3;
  char local_78 [8];
  char note_text [80];
  wchar_t oid_local;
  keycode_t kStack_10;
  keypress ch_local;
  
  register0x00000038 = ch._0_8_;
  kStack_10 = ch.code;
  note_text._72_4_ = oid;
  if (kStack_10 == 0x7d) {
    rune_set_note((long)oid,(char *)0x0);
  }
  else if (kStack_10 == 0x7b) {
    memset(local_78,0,0x50);
    screen_save();
    prt("Inscribe with: ",L'\0',L'\0');
    qVar2 = rune_note((long)(int)note_text._72_4_);
    if (qVar2 != 0) {
      qVar2 = rune_note((long)(int)note_text._72_4_);
      pcVar3 = quark_str(qVar2);
      strnfmt(local_78,0x50,"%s",pcVar3);
    }
    _Var1 = askfor_aux(local_78,0x50,
                       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
    if (_Var1) {
      qVar2 = rune_note((long)(int)note_text._72_4_);
      if (qVar2 != 0) {
        rune_set_note((long)(int)note_text._72_4_,(char *)0x0);
      }
      rune_set_note((long)(int)note_text._72_4_,local_78);
      rune_autoinscribe(player,note_text._72_4_);
      player->upkeep->redraw = player->upkeep->redraw | 0x60000;
    }
    screen_load();
  }
  return;
}

Assistant:

static void rune_xtra_act(struct keypress ch, int oid)
{
	/* Uninscribe */
	if (ch.code == '}') {
		rune_set_note(oid, NULL);
	} else if (ch.code == '{') {
		/* Inscribe */
		char note_text[80] = "";

		/* Avoid the prompt getting in the way */
		screen_save();

		/* Prompt */
		prt("Inscribe with: ", 0, 0);

		/* Default note */
		if (rune_note(oid))
			strnfmt(note_text, sizeof(note_text), "%s",
					quark_str(rune_note(oid)));

		/* Get an inscription */
		if (askfor_aux(note_text, sizeof(note_text), NULL)) {
			/* Remove old inscription if existent */
			if (rune_note(oid))
				rune_set_note(oid, NULL);

			/* Add the autoinscription */
			rune_set_note(oid, note_text);
			rune_autoinscribe(player, oid);

			/* Redraw gear */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
		}

		/* Reload the screen */
		screen_load();
	}
}